

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

int sexp_buffered_write_char(sexp ctx,int c,sexp p)

{
  sexp psVar1;
  int iVar2;
  
  if (((undefined1 *)(p->value).port.size <=
       (undefined1 *)((long)&((p->value).type.print)->tag + 1U)) &&
     (iVar2 = sexp_buffered_flush(ctx,p,0), iVar2 != 0)) {
    return iVar2;
  }
  psVar1 = (p->value).type.print;
  (p->value).type.print = (sexp)((long)&psVar1->tag + 1);
  *(char *)((long)&psVar1->tag + (long)&((p->value).type.setters)->tag) = (char)c;
  return 0;
}

Assistant:

int sexp_buffered_write_char (sexp ctx, int c, sexp p) {
  int res;
  if (sexp_port_offset(p)+1 >= sexp_port_size(p))
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return res;
  sexp_port_buf(p)[sexp_port_offset(p)++] = c;
  return 0;
}